

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O2

void __thiscall Lodtalk::StackInterpreter::interpretSpecialMessageDivide(StackInterpreter *this)

{
  uint8_t **ppuVar1;
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar2;
  StackMemory *pSVar3;
  uint8_t *puVar4;
  size_t sVar5;
  bool bVar6;
  SmallIntegerValue SVar7;
  SmallIntegerValue SVar8;
  double dVar9;
  double dVar10;
  Oop b;
  Oop a;
  
  paVar2 = (anon_union_8_4_0eb573b0_for_Oop_0 *)(this->stack->stackFrame).stackPointer;
  a.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)paVar2[1].uintValue;
  b.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)paVar2->uintValue;
  if ((SUB84(b.field_0.uintValue,0) & SUB84(a.field_0.uintValue,0) & 1) == 0) {
    bVar6 = Oop::isFloatOrInt(&a);
    if ((bVar6) && (bVar6 = Oop::isFloatOrInt(&b), bVar6)) {
      sVar5 = this->pc;
      this->pc = sVar5 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar5);
      ppuVar1 = &(this->stack->stackFrame).stackPointer;
      *ppuVar1 = *ppuVar1 + 0x10;
      dVar9 = Oop::decodeFloatOrInt(&a);
      dVar10 = Oop::decodeFloatOrInt(&b);
      pushFloatObject(this,dVar9 / dVar10);
      return;
    }
  }
  else {
    SVar7 = Oop::decodeSmallInteger(&a);
    SVar8 = Oop::decodeSmallInteger(&b);
    if (SVar7 % SVar8 == 0) {
      pSVar3 = this->stack;
      puVar4 = (pSVar3->stackFrame).stackPointer;
      (pSVar3->stackFrame).stackPointer = puVar4 + 0x10;
      sVar5 = this->pc;
      this->pc = sVar5 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar5);
      (pSVar3->stackFrame).stackPointer = puVar4 + 8;
      *(long *)(puVar4 + 8) = (SVar7 / SVar8) * 2 + 1;
      return;
    }
  }
  sendSpecialArgumentCount(this,Divide,1);
  return;
}

Assistant:

void interpretSpecialMessageDivide()
    {
        Oop a = stackOopAt(1);
        Oop b = stackOopAt(0);

        if(a.isSmallInteger() && b.isSmallInteger())
        {
            auto ia = a.decodeSmallInteger();
            auto ib = b.decodeSmallInteger();
            if(ia % ib == 0)
            {
                popMultiplesOops(2);
                fetchNextInstructionOpcode();

                pushOop(Oop::encodeSmallInteger(ia / ib));
            }
            else
            {
                // Allow the image side to make a fraction.
                sendSpecialArgumentCount(SpecialMessageSelector::Divide, 1);
            }
        }
        else if(a.isFloatOrInt() && b.isFloatOrInt())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto fa = a.decodeFloatOrInt();
            auto fb = b.decodeFloatOrInt();
            pushFloatObject(fa / fb);
        }
        else
        {
            sendSpecialArgumentCount(SpecialMessageSelector::Divide, 1);
        }
    }